

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thanm.c
# Opt level: O0

void anm_extract(anm_entry_t *entry,char *filename,uint version)

{
  int iVar1;
  FILE *__s;
  uchar *__ptr;
  uint32_t local_90;
  int local_8c;
  uint32_t local_88;
  uint32_t local_84;
  uchar *temp_data;
  anm_entry_t *entryp;
  FILE *stream;
  int is_png;
  uint32_t oy;
  uint32_t ox;
  uint y;
  uint f;
  image_t image;
  format_t formats [5];
  uint version_local;
  char *filename_local;
  anm_entry_t *entry_local;
  
  image.format = FORMAT_GRAY8;
  image._20_4_ = 5;
  image.data._0_4_ = 0;
  image.data._4_4_ = 0;
  image.width = 0xffffffff;
  util_total_entry_size(entry,(uint *)&image,(uint *)((long)&image.data + 4));
  if (((int)image.data != 0) && (image.data._4_4_ != 0)) {
    util_makepath(filename);
    if (option_dont_add_offset_border == 0) {
      local_84 = entry->header->x;
      local_88 = entry->header->y;
    }
    else {
      local_84 = 0;
      local_88 = 0;
    }
    stream._4_4_ = 0;
    if (version == 0x13) {
      iVar1 = png_identify((uint8_t *)(entry->thtx + 1),entry->thtx->size);
      if ((iVar1 == 0) ||
         (((local_84 == 0 && (local_88 == 0)) && (entry->next_by_name == (anm_entry_t *)0x0)))) {
        if (1 < option_verbose) {
          fprintf(_stderr,"%s: not composing %s\n",argv0,filename);
        }
        if (((local_84 != 0) || (local_88 != 0)) ||
           ((entry->next_by_name != (anm_entry_t *)0x0 &&
            (((entry->next_by_name->next_by_name != (anm_entry_t *)0x0 ||
              (entry->thtx->size != entry->next_by_name->thtx->size)) ||
             (iVar1 = memcmp(entry->thtx + 1,entry->next_by_name->thtx + 1,(ulong)entry->thtx->size)
             , iVar1 != 0)))))) {
          fprintf(_stderr,"%s: warning: %s can\'t be composed because it\'s a JPEG\n",argv0,filename
                 );
        }
        __s = fopen(filename,"wb");
        if (__s == (FILE *)0x0) {
          return;
        }
        fwrite(entry->thtx + 1,1,(ulong)entry->thtx->size,__s);
        fclose(__s);
        return;
      }
      if (1 < option_verbose) {
        fprintf(_stderr,"%s: composing %s\n",argv0,filename);
      }
      stream._4_4_ = 1;
    }
    _y = (uchar *)malloc((ulong)(uint)((int)image.data * image.data._4_4_ * 4));
    memset(_y,0xff,(ulong)(uint)((int)image.data * image.data._4_4_ * 4));
    for (temp_data = (uchar *)entry; temp_data != (uchar *)0x0;
        temp_data = *(uchar **)(temp_data + 0x28)) {
      for (ox = 0; ox < 5; ox = ox + 1) {
        if (formats[(ulong)ox - 2] == (uint)*(ushort *)(*(long *)(temp_data + 8) + 6)) {
          if (option_dont_add_offset_border == 0) {
            local_8c = *(int *)(*(long *)temp_data + 0x20);
            local_90 = *(uint32_t *)(*(long *)temp_data + 0x24);
          }
          else {
            local_8c = 0;
            local_90 = 0;
          }
          __ptr = entry_to_rgba((anm_entry_t *)temp_data,stream._4_4_);
          for (oy = local_90; oy < local_90 + *(ushort *)(*(long *)(temp_data + 8) + 10);
              oy = oy + 1) {
            memcpy(_y + (ulong)(uint)(local_8c << 2) + (ulong)(oy * (int)image.data * 4),
                   __ptr + (oy - local_90) * (uint)*(ushort *)(*(long *)(temp_data + 8) + 8) * 4,
                   (long)(int)((uint)*(ushort *)(*(long *)(temp_data + 8) + 8) << 2));
          }
          free(__ptr);
          temp_data[0x30] = '\x01';
          temp_data[0x31] = '\0';
          temp_data[0x32] = '\0';
          temp_data[0x33] = '\0';
        }
      }
    }
    png_write(filename,(image_t *)&y);
    free(_y);
  }
  return;
}

Assistant:

static void
anm_extract(
    anm_entry_t* entry,
    const char* filename,
    unsigned version)
{
    const format_t formats[] = {
        FORMAT_GRAY8,
        FORMAT_ARGB4444,
        FORMAT_RGB565,
        FORMAT_BGRA8888,
        FORMAT_RGBA8888
    };
    image_t image;

    unsigned int f, y;

    image.width = 0;
    image.height = 0;
    image.format = FORMAT_RGBA8888;

    util_total_entry_size(entry, &image.width, &image.height);

    if (image.width == 0 || image.height == 0) {
        /* Then there's nothing to extract. */
        return;
    }

    util_makepath(filename);

    uint32_t ox = option_dont_add_offset_border ? 0 : entry->header->x;
    uint32_t oy = option_dont_add_offset_border ? 0 : entry->header->y;
    int is_png = 0;

    /* NEWHU: 19 */
    if (version == 19) {
        if (png_identify(entry->thtx->data, entry->thtx->size) &&
                (ox || oy || entry->next_by_name)) {
            if (option_verbose >= 2)
                fprintf(stderr, "%s: composing %s\n", argv0, filename);
            is_png = 1;
        } else {
            if (option_verbose >= 2)
                fprintf(stderr, "%s: not composing %s\n", argv0, filename);
            /* TH19's ability/dummy.png is used twice, but it's the same texture.
             * Avoid printing a warning in this particular case. */
            if (ox || oy || entry->next_by_name && (entry->next_by_name->next_by_name ||
                    entry->thtx->size != entry->next_by_name->thtx->size ||
                    memcmp(entry->thtx->data, entry->next_by_name->thtx->data, entry->thtx->size))) {
                fprintf(stderr, "%s: warning: %s can't be composed because it's a JPEG\n", argv0, filename);
            }
            FILE* stream = fopen(filename, "wb");
            if (stream) {
                fwrite(entry->thtx->data, 1, entry->thtx->size, stream);
                fclose(stream);
            }
            return;
        }
    }

    image.data = malloc(image.width * image.height * 4);
    /* XXX: Why 0xff? */
    memset(image.data, 0xff, image.width* image.height * 4);
    for (anm_entry_t *entryp = entry; entryp; entryp = entryp->next_by_name) {
        for (f = 0; f < sizeof(formats) / sizeof(formats[0]); ++f) {
            if (formats[f] == entryp->thtx->format) {
                ox = option_dont_add_offset_border ? 0 : entryp->header->x;
                oy = option_dont_add_offset_border ? 0 : entryp->header->y;
                unsigned char* temp_data = entry_to_rgba(entryp, is_png);
                for (y = oy; y < oy + entryp->thtx->h; ++y) {
                    memcpy(image.data + y * image.width * 4 + ox * 4,
                        temp_data + (y - oy) * entryp->thtx->w * 4,
                        entryp->thtx->w * 4);
                }
                free(temp_data);
                entryp->processed = 1;
            }
        }
    }

    png_write(filename, &image);
    free(image.data);
}